

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall trun::Process_Unix::SetNonBlockingPipe(Process_Unix *this,int *filedes)

{
  int iVar1;
  ILogger *pIVar2;
  int *piVar3;
  allocator<char> local_29;
  string local_28;
  
  iVar1 = fcntl(*filedes,0x800);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Process_Unix",&local_29)
    ;
    pIVar2 = gnilk::Logger::GetLogger(&local_28);
    piVar3 = __errno_location();
    gnilk::Log::Error<char_const*,int>(pIVar2,"fcntl %d",*piVar3);
  }
  else {
    iVar1 = fcntl(filedes[1],0x800);
    if (iVar1 != -1) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"conapp",&local_29);
    pIVar2 = gnilk::Logger::GetLogger(&local_28);
    piVar3 = __errno_location();
    gnilk::Log::Error<char_const*,int>(pIVar2,"fcntl %d",*piVar3);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool Process_Unix::SetNonBlockingPipe(int *filedes) {
	int status = fcntl(filedes[0], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("fcntl %d", errno);
		return false;
	}
	status = fcntl(filedes[1], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("conapp")->Error("fcntl %d", errno);
		return false;			
	}
	return true;
}